

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall
ON_SubD::ClearComponentGroupIds
          (ON_SubD *this,bool bClearVertexGroupIds,bool bClearEdgeGroupIds,bool bClearFaceGroupIds)

{
  ON_SubDVertex *pOVar1;
  uint uVar2;
  undefined7 in_register_00000031;
  ON_SubDVertexIterator vit;
  ON_SubDEdgeIterator local_60;
  
  uVar2 = 0;
  if ((int)CONCAT71(in_register_00000031,bClearVertexGroupIds) != 0) {
    ON_SubDVertexIterator::ON_SubDVertexIterator((ON_SubDVertexIterator *)&local_60,this);
    local_60.m_edge_index = 0;
    local_60.m_e_current = local_60.m_e_first;
    uVar2 = 0;
    if ((ON_SubDVertex *)local_60.m_e_first != (ON_SubDVertex *)0x0) {
      pOVar1 = (ON_SubDVertex *)local_60.m_e_first;
      do {
        if ((pOVar1->super_ON_SubDComponentBase).m_group_id != 0) {
          (pOVar1->super_ON_SubDComponentBase).m_group_id = 0;
          uVar2 = uVar2 + 1;
        }
        pOVar1 = ON_SubDVertexIterator::NextVertex((ON_SubDVertexIterator *)&local_60);
      } while (pOVar1 != (ON_SubDVertex *)0x0);
    }
    ON_SubDRef::~ON_SubDRef(&local_60.m_subd_ref);
  }
  if (bClearEdgeGroupIds) {
    ON_SubDEdgeIterator::ON_SubDEdgeIterator(&local_60,this);
    local_60.m_edge_index = 0;
    local_60.m_e_current = local_60.m_e_first;
    if ((ON_SubDVertex *)local_60.m_e_first != (ON_SubDVertex *)0x0) {
      pOVar1 = (ON_SubDVertex *)local_60.m_e_first;
      do {
        if ((pOVar1->super_ON_SubDComponentBase).m_group_id != 0) {
          (pOVar1->super_ON_SubDComponentBase).m_group_id = 0;
          uVar2 = uVar2 + 1;
        }
        pOVar1 = (ON_SubDVertex *)ON_SubDEdgeIterator::NextEdge(&local_60);
      } while (pOVar1 != (ON_SubDVertex *)0x0);
    }
    ON_SubDRef::~ON_SubDRef(&local_60.m_subd_ref);
  }
  if (bClearFaceGroupIds) {
    ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)&local_60,this);
    local_60.m_edge_index = 0;
    local_60.m_e_current = local_60.m_e_first;
    if ((ON_SubDVertex *)local_60.m_e_first != (ON_SubDVertex *)0x0) {
      do {
        if ((((ON_SubDVertex *)local_60.m_e_first)->super_ON_SubDComponentBase).m_group_id != 0) {
          (((ON_SubDVertex *)local_60.m_e_first)->super_ON_SubDComponentBase).m_group_id = 0;
          uVar2 = uVar2 + 1;
        }
        local_60.m_e_first =
             (ON_SubDEdge *)ON_SubDFaceIterator::NextFace((ON_SubDFaceIterator *)&local_60);
      } while ((ON_SubDVertex *)local_60.m_e_first != (ON_SubDVertex *)0x0);
    }
    ON_SubDRef::~ON_SubDRef(&local_60.m_subd_ref);
  }
  return uVar2;
}

Assistant:

unsigned int ON_SubD::ClearComponentGroupIds(
  bool bClearVertexGroupIds,
  bool bClearEdgeGroupIds,
  bool bClearFaceGroupIds
) const
{
  unsigned int clear_count = 0;

  if (bClearVertexGroupIds)
  {
    ON_SubDVertexIterator vit(*this);
    for (const ON_SubDVertex* v = vit.FirstVertex(); nullptr != v; v = vit.NextVertex())
    {
      if (0 != v->m_group_id)
      {
        v->m_group_id = 0;
        clear_count++;
      }
    }
  }

  if (bClearEdgeGroupIds)
  {
    ON_SubDEdgeIterator eit(*this);
    for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
    {
      if (0 != e->m_group_id)
      {
        e->m_group_id = 0;
        clear_count++;
      }
    }
  }

  if (bClearFaceGroupIds)
  {
    ON_SubDFaceIterator fit(*this);
    for (const ON_SubDFace* f = fit.FirstFace(); nullptr != f; f = fit.NextFace())
    {
      if (0 != f->m_group_id)
      {
        f->m_group_id = 0;
        clear_count++;
      }
    }
  }

  return clear_count;
}